

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integerCoding.cpp
# Opt level: O3

size_t tinyusdz::Usd_IntegerCompression64::CompressToBuffer
                 (int64_t *ints,size_t numInts,char *compressed,string *err)

{
  long *plVar1;
  long lVar2;
  mapped_type *pmVar3;
  byte *pbVar4;
  char *input;
  size_t sVar5;
  byte bVar6;
  int iVar7;
  ulong uVar8;
  byte bVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  bool bVar14;
  SInt val;
  unordered_map<long,_unsigned_long,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_unsigned_long>_>_>
  counts;
  long local_88;
  string *local_80;
  ulong local_78;
  char *local_70;
  _Hashtable<long,_std::pair<const_long,_unsigned_long>,_std::allocator<std::pair<const_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_68;
  
  if (numInts == 0) {
    input = (char *)operator_new__(0);
    sVar5 = LZ4Compression::CompressToBuffer(input,compressed,0,err);
    operator_delete__(input);
    return sVar5;
  }
  local_78 = numInts * 2 + 7 >> 3;
  local_80 = err;
  local_70 = compressed;
  plVar1 = (long *)operator_new__(local_78 + numInts * 8 + 8);
  local_68._M_buckets = &local_68._M_single_bucket;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  lVar11 = 0;
  lVar2 = 0;
  uVar12 = 0;
  lVar10 = 0;
  do {
    local_88 = *(long *)((long)ints + lVar11) - lVar2;
    pmVar3 = std::__detail::
             _Map_base<long,_std::pair<const_long,_unsigned_long>,_std::allocator<std::pair<const_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<long,_std::pair<const_long,_unsigned_long>,_std::allocator<std::pair<const_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&local_68,&local_88);
    uVar8 = *pmVar3 + 1;
    *pmVar3 = uVar8;
    bVar14 = uVar8 == uVar12;
    lVar13 = local_88;
    if (((uVar8 <= uVar12) && (uVar8 = uVar12, lVar13 = lVar10, bVar14)) && (lVar10 < local_88)) {
      lVar13 = local_88;
    }
    lVar2 = *(long *)((long)ints + lVar11);
    lVar11 = lVar11 + 8;
    uVar12 = uVar8;
    lVar10 = lVar13;
  } while (numInts * 8 - lVar11 != 0);
  std::
  _Hashtable<long,_std::pair<const_long,_unsigned_long>,_std::allocator<std::pair<const_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_68);
  *plVar1 = lVar13;
  pbVar4 = (byte *)(plVar1 + 1);
  plVar1 = (long *)((long)plVar1 + local_78 + 8);
  if (3 < numInts) {
    lVar2 = 0;
    do {
      iVar7 = 0;
      bVar9 = 0;
      lVar10 = lVar2;
      do {
        lVar2 = *ints;
        lVar10 = lVar2 - lVar10;
        if (lVar10 != lVar13) {
          bVar6 = (byte)iVar7;
          if ((short)lVar10 == lVar10) {
            bVar6 = (byte)(1 << (bVar6 & 0x1f));
            *(short *)plVar1 = (short)lVar10;
            lVar10 = 2;
          }
          else if (lVar10 - 0x80000000U < 0xffffffff00000000) {
            bVar6 = (byte)(3 << (bVar6 & 0x1f));
            *plVar1 = lVar10;
            lVar10 = 8;
          }
          else {
            bVar6 = (byte)(2 << (bVar6 & 0x1f));
            *(int *)plVar1 = (int)lVar10;
            lVar10 = 4;
          }
          plVar1 = (long *)((long)plVar1 + lVar10);
          bVar9 = bVar9 | bVar6;
        }
        ints = ints + 1;
        iVar7 = iVar7 + 2;
        lVar10 = lVar2;
      } while (iVar7 != 8);
      *pbVar4 = bVar9;
      pbVar4 = pbVar4 + 1;
      numInts = numInts - 4;
    } while (3 < numInts);
  }
  sVar5 = (*(code *)(&DAT_001114ec + *(int *)(&DAT_001114ec + numInts * 4)))();
  return sVar5;
}

Assistant:

size_t
Usd_IntegerCompression64::CompressToBuffer(
    int64_t const *ints, size_t numInts, char *compressed, std::string *err)
{
    return _CompressIntegers(ints, numInts, compressed, err);
}